

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * validateEmbeddingWeightsBias
                   (Result *__return_storage_ptr__,NeuralNetworkLayer *layer,WeightParams *weights,
                   WeightParams *bias)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  ConvolutionLayerParams *pCVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  void *pvVar8;
  pointer pcVar9;
  uint uVar10;
  char cVar11;
  bool bVar12;
  long *plVar13;
  Result *extraout_RAX;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  Result *extraout_RAX_00;
  Result *extraout_RAX_01;
  Result *extraout_RAX_02;
  Result *extraout_RAX_03;
  Result *extraout_RAX_04;
  Result *extraout_RAX_05;
  Result *extraout_RAX_06;
  char cVar15;
  long *plVar16;
  size_type *psVar17;
  byte bVar18;
  _Alloc_hider _Var19;
  uint uVar20;
  uint64_t uVar21;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string layer_type;
  string local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  string local_80;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  uint64_t local_40;
  long local_38;
  Result *pRVar14;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  if (layer->_oneof_case_[0] == 0x96) {
    pCVar4 = (layer->layer_).convolution_;
    local_38 = *(long *)&pCVar4->_kernelsize_cached_byte_size_;
    uVar21._0_4_ = (pCVar4->stride_).current_size_;
    uVar21._4_4_ = (pCVar4->stride_).total_size_;
    bVar18 = *(byte *)&(pCVar4->stride_).arena_or_elements_;
    std::__cxx11::string::_M_replace((ulong)&local_80,0,(char *)0x0,0x3b56f8);
  }
  else {
    if (layer->_oneof_case_[0] != 0x410) {
      CoreML::Result::Result(__return_storage_ptr__);
      pRVar14 = extraout_RAX;
      goto LAB_003468a2;
    }
    pCVar4 = (layer->layer_).convolution_;
    local_38 = *(long *)&pCVar4->_kernelsize_cached_byte_size_;
    uVar21._0_4_ = (pCVar4->stride_).current_size_;
    uVar21._4_4_ = (pCVar4->stride_).total_size_;
    bVar18 = *(byte *)&(pCVar4->stride_).arena_or_elements_;
    std::__cxx11::string::_M_replace((ulong)&local_80,0,(char *)0x0,0x3c05be);
  }
  iVar3 = (weights->floatvalue_).current_size_;
  lVar5 = *(long *)(((ulong)(weights->float16value_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  uVar20 = (0 < iVar3) + 1;
  if (lVar5 == 0) {
    uVar20 = (uint)(0 < iVar3);
  }
  lVar6 = *(long *)(((ulong)(weights->rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  lVar7 = *(long *)(((ulong)(weights->int8rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  uVar10 = (uint)(lVar7 == 0);
  uVar20 = (uVar20 - (lVar6 == 0)) + 2;
  cVar11 = '\x04';
  cVar15 = '\x04';
  if (uVar20 - uVar10 < 2) {
    cVar15 = '\x05';
    if (uVar20 != uVar10) {
      cVar15 = iVar3 < 1;
    }
    if (((((lVar5 == 0) && (uVar20 != uVar10)) && (iVar3 < 1)) &&
        (((lVar6 == 0 ||
          (weights == (WeightParams *)CoreML::Specification::_WeightParams_default_instance_)) ||
         (cVar15 = '\x02', weights->quantization_ == (QuantizationParams *)0x0)))) &&
       (((lVar7 == 0 ||
         (weights == (WeightParams *)CoreML::Specification::_WeightParams_default_instance_)) ||
        (cVar15 = '\x03', weights->quantization_ == (QuantizationParams *)0x0)))) {
      cVar15 = '\x05';
    }
  }
  iVar3 = (bias->floatvalue_).current_size_;
  lVar5 = *(long *)(((ulong)(bias->float16value_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  uVar20 = (0 < iVar3) + 1;
  if (lVar5 == 0) {
    uVar20 = (uint)(0 < iVar3);
  }
  lVar6 = *(long *)(((ulong)(bias->rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  lVar7 = *(long *)(((ulong)(bias->int8rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  uVar10 = (uint)(lVar7 == 0);
  uVar20 = (uVar20 - (lVar6 == 0)) + 2;
  if (uVar20 - uVar10 < 2) {
    cVar11 = '\x05';
    if (uVar20 != uVar10) {
      cVar11 = iVar3 < 1;
    }
    if ((((lVar5 == 0) && (uVar20 != uVar10)) && (iVar3 < 1)) &&
       ((((lVar6 == 0 ||
          (bias == (WeightParams *)CoreML::Specification::_WeightParams_default_instance_)) ||
         (cVar11 = '\x02', bias->quantization_ == (QuantizationParams *)0x0)) &&
        (((lVar7 == 0 ||
          (bias == (WeightParams *)CoreML::Specification::_WeightParams_default_instance_)) ||
         (cVar11 = '\x03', bias->quantization_ == (QuantizationParams *)0x0)))))) {
      cVar11 = '\x05';
    }
  }
  if ((cVar15 == '\x04') || ((cVar11 == '\x04' & bVar18) != 0)) {
    local_a0[0] = &local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,local_80._M_dataplus._M_p,
               local_80._M_dataplus._M_p + local_80._M_string_length);
    std::__cxx11::string::append((char *)local_a0);
    plVar13 = (long *)std::__cxx11::string::_M_append
                                ((char *)local_a0,
                                 *(ulong *)((ulong)(layer->name_).tagged_ptr_.ptr_ &
                                           0xfffffffffffffffe));
    plVar16 = plVar13 + 2;
    if ((long *)*plVar13 == plVar16) {
      local_50 = *plVar16;
      lStack_48 = plVar13[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar16;
      local_60 = (long *)*plVar13;
    }
    local_58 = plVar13[1];
    *plVar13 = (long)plVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_60);
    psVar17 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_c0.field_2._M_allocated_capacity = *psVar17;
      local_c0.field_2._8_8_ = plVar13[3];
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar17;
      local_c0._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_c0._M_string_length = plVar13[1];
    *plVar13 = (long)psVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
    }
    if (local_a0[0] != &local_90) {
      operator_delete(local_a0[0],local_90._M_allocated_capacity + 1);
    }
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_c0);
    pRVar14 = extraout_RAX_01;
    local_90._M_allocated_capacity = local_c0.field_2._M_allocated_capacity;
    _Var19._M_p = local_c0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p == &local_c0.field_2) goto LAB_003468a2;
  }
  else {
    if ((bVar18 == 0) ||
       (((cVar15 != '\x01' || (cVar11 != '\0')) && ((cVar15 != '\0' || (cVar11 != '\x01')))))) {
      pvVar8 = (layer->name_).tagged_ptr_.ptr_;
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      local_40 = uVar21;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"weight","");
      CoreML::validateGeneralWeightParams
                (__return_storage_ptr__,weights,local_38 * local_40,local_40,&local_80,
                 (string *)((ulong)pvVar8 & 0xfffffffffffffffe),&local_c0);
      paVar2 = &local_c0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      bVar12 = CoreML::Result::good(__return_storage_ptr__);
      pRVar14 = (Result *)CONCAT71(extraout_var,bVar12);
      if (bVar12) {
        pcVar9 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar9 != paVar1) {
          operator_delete(pcVar9,paVar1->_M_allocated_capacity + 1);
        }
        if (bVar18 != 0) {
          pvVar8 = (layer->name_).tagged_ptr_.ptr_;
          local_c0._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"bias","");
          CoreML::validateGeneralWeightParams
                    (__return_storage_ptr__,bias,local_40,1,&local_80,
                     (string *)((ulong)pvVar8 & 0xfffffffffffffffe),&local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != paVar2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          bVar12 = CoreML::Result::good(__return_storage_ptr__);
          pRVar14 = (Result *)CONCAT71(extraout_var_00,bVar12);
          if (!bVar12) goto LAB_003468a2;
          pcVar9 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar9 != paVar1) {
            operator_delete(pcVar9,paVar1->_M_allocated_capacity + 1);
          }
        }
        CoreML::Result::Result(__return_storage_ptr__);
        pRVar14 = extraout_RAX_00;
      }
      goto LAB_003468a2;
    }
    local_a0[0] = &local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,local_80._M_dataplus._M_p,
               local_80._M_dataplus._M_p + local_80._M_string_length);
    std::__cxx11::string::append((char *)local_a0);
    plVar13 = (long *)std::__cxx11::string::_M_append
                                ((char *)local_a0,
                                 *(ulong *)((ulong)(layer->name_).tagged_ptr_.ptr_ &
                                           0xfffffffffffffffe));
    plVar16 = plVar13 + 2;
    if ((long *)*plVar13 == plVar16) {
      local_50 = *plVar16;
      lStack_48 = plVar13[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar16;
      local_60 = (long *)*plVar13;
    }
    local_58 = plVar13[1];
    *plVar13 = (long)plVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_60);
    psVar17 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_c0.field_2._M_allocated_capacity = *psVar17;
      local_c0.field_2._8_8_ = plVar13[3];
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar17;
      local_c0._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_c0._M_string_length = plVar13[1];
    *plVar13 = (long)psVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_c0);
    pRVar14 = extraout_RAX_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      pRVar14 = extraout_RAX_03;
    }
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
      pRVar14 = extraout_RAX_04;
    }
    _Var19._M_p = (pointer)local_a0[0];
    if (local_a0[0] == &local_90) goto LAB_003468a2;
  }
  operator_delete(_Var19._M_p,local_90._M_allocated_capacity + 1);
  pRVar14 = extraout_RAX_05;
LAB_003468a2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
    pRVar14 = extraout_RAX_06;
  }
  return pRVar14;
}

Assistant:

static Result validateEmbeddingWeightsBias(const Specification::NeuralNetworkLayer& layer,
                                              const Specification::WeightParams& weights,
                                              const Specification::WeightParams& bias) {
    bool has_bias;
    uint64_t input_dim;
    uint64_t output_channels;
    std::string layer_type;

    switch(layer.layer_case()) {
        case Specification::NeuralNetworkLayer::LayerCase::kEmbedding: {
            const auto& params = layer.embedding();
            input_dim = params.inputdim();
            output_channels = params.outputchannels();
            has_bias = params.hasbias();
            layer_type = "Embedding";
            break;
        }
        case Specification::NeuralNetworkLayer::LayerCase::kEmbeddingND: {
            const auto& params = layer.embeddingnd();
            input_dim = params.vocabsize();
            output_channels = params.embeddingsize();
            has_bias = params.hasbias();
            layer_type = "EmbeddingND";
            break;
        }
        default:
            return Result();
    }

    WeightParamType weightsValueType, biasValueType;
    weightsValueType = valueType(weights);
    biasValueType = valueType(bias);

    // Only float32 or float16 parameters can be populated at any time
    if ((weightsValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)){
        std::string err = layer_type + " '" + layer.name() + "' has invalid weights/bias fields. Field value types should match and should either be half or full precision.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (has_bias){
        if ((weightsValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (weightsValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)){
            return Result(ResultType::INVALID_MODEL_PARAMETERS, layer_type + " layer '" + layer.name() +
                          "has unmatched precisions of weights/bias They should either be half or full precision.");
        }
    }
    // Validate weight and bias sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weights, input_dim * output_channels, output_channels,
                                                                  layer_type, layer.name(), "weight"));
    if (has_bias){
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(bias, output_channels, 1,
                                                                      layer_type, layer.name(), "bias"));
    }

    return Result();
}